

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O2

void get_msurf_descriptor_haar_unroll_2_8_True(integral_image *iimage,interest_point *ipoint)

{
  long lVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  byte bVar14;
  byte bVar15;
  byte bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int i;
  int iVar19;
  int iVar20;
  int col;
  int col_00;
  int col_01;
  int col_02;
  int col_03;
  int col_04;
  int col_05;
  int iVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  int iVar25;
  long lVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  ulong uVar33;
  float *pfVar34;
  long lVar35;
  float *pfVar36;
  int col_06;
  float *pfVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar50;
  float fVar51;
  float fVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar66;
  undefined1 auVar67 [16];
  float fVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar74 [12];
  undefined1 auVar73 [64];
  float fVar75;
  undefined1 in_ZMM8 [64];
  undefined1 in_ZMM9 [64];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  float fVar78;
  undefined1 auVar79 [64];
  
  auVar46._8_4_ = 0x3effffff;
  auVar46._0_8_ = 0x3effffff3effffff;
  auVar46._12_4_ = 0x3effffff;
  auVar45._8_4_ = 0x80000000;
  auVar45._0_8_ = 0x8000000080000000;
  auVar45._12_4_ = 0x80000000;
  fVar52 = ipoint->scale;
  auVar79 = ZEXT464((uint)fVar52);
  auVar42 = ZEXT816(0x3fe0000000000000);
  auVar73 = ZEXT1664(auVar42);
  auVar47 = ZEXT416((uint)fVar52);
  auVar38 = vpternlogd_avx512vl(auVar46,auVar47,auVar45,0xf8);
  auVar38 = ZEXT416((uint)(fVar52 + auVar38._0_4_));
  auVar38 = vroundss_avx(auVar38,auVar38,0xb);
  fVar50 = -0.08 / (fVar52 * fVar52);
  iVar25 = (int)auVar38._0_4_;
  auVar39._0_4_ = (int)auVar38._0_4_;
  auVar39._4_4_ = (int)auVar38._4_4_;
  auVar39._8_4_ = (int)auVar38._8_4_;
  auVar39._12_4_ = (int)auVar38._12_4_;
  auVar38 = vcvtdq2ps_avx(auVar39);
  auVar39 = vpternlogd_avx512vl(auVar46,ZEXT416((uint)ipoint->x),auVar45,0xf8);
  auVar39 = ZEXT416((uint)(ipoint->x + auVar39._0_4_));
  auVar39 = vroundss_avx(auVar39,auVar39,0xb);
  auVar40._0_8_ = (double)auVar39._0_4_;
  auVar40._8_8_ = auVar39._8_8_;
  auVar44._0_8_ = (double)fVar52;
  auVar44._8_8_ = 0;
  auVar39 = vfmadd231sd_fma(auVar40,auVar44,auVar42);
  auVar43._0_4_ = (float)auVar39._0_8_;
  auVar43._4_12_ = auVar39._4_12_;
  auVar39 = vpternlogd_avx512vl(auVar46,ZEXT416((uint)ipoint->y),auVar45,0xf8);
  fVar3 = auVar43._0_4_ - auVar38._0_4_;
  auVar39 = ZEXT416((uint)(ipoint->y + auVar39._0_4_));
  auVar39 = vroundss_avx(auVar39,auVar39,0xb);
  auVar40 = ZEXT416((uint)fVar3);
  auVar41._0_8_ = (double)auVar39._0_4_;
  auVar41._8_8_ = auVar39._8_8_;
  auVar39 = vfmadd231sd_fma(auVar41,auVar44,auVar42);
  auVar42._0_4_ = (float)auVar39._0_8_;
  auVar42._4_12_ = auVar39._4_12_;
  fVar78 = auVar42._0_4_ - auVar38._0_4_;
  auVar41 = ZEXT416((uint)fVar52);
  auVar38 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar41,auVar43);
  auVar39 = vpternlogd_avx512vl(auVar46,auVar38,auVar45,0xf8);
  auVar38 = ZEXT416((uint)(auVar38._0_4_ + auVar39._0_4_));
  auVar38 = vroundss_avx(auVar38,auVar38,0xb);
  if (iVar25 < (int)auVar38._0_4_) {
    auVar48._8_4_ = 0x3effffff;
    auVar48._0_8_ = 0x3effffff3effffff;
    auVar48._12_4_ = 0x3effffff;
    auVar49._8_4_ = 0x80000000;
    auVar49._0_8_ = 0x8000000080000000;
    auVar49._12_4_ = 0x80000000;
    auVar38 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar41,auVar42);
    auVar39 = vpternlogd_avx512vl(auVar49,auVar38,auVar48,0xea);
    auVar38 = ZEXT416((uint)(auVar38._0_4_ + auVar39._0_4_));
    auVar38 = vroundss_avx(auVar38,auVar38,0xb);
    if (iVar25 < (int)auVar38._0_4_) {
      auVar38 = vfmadd231ss_fma(auVar43,auVar41,ZEXT416(0x41300000));
      auVar69._8_4_ = 0x80000000;
      auVar69._0_8_ = 0x8000000080000000;
      auVar69._12_4_ = 0x80000000;
      auVar39 = vpternlogd_avx512vl(auVar69,auVar38,auVar48,0xea);
      auVar38 = ZEXT416((uint)(auVar38._0_4_ + auVar39._0_4_));
      auVar38 = vroundss_avx(auVar38,auVar38,0xb);
      if ((int)auVar38._0_4_ + iVar25 <= iimage->width) {
        auVar38 = vfmadd231ss_fma(auVar42,auVar41,ZEXT416(0x41300000));
        auVar12._8_4_ = 0x80000000;
        auVar12._0_8_ = 0x8000000080000000;
        auVar12._12_4_ = 0x80000000;
        auVar39 = vpternlogd_avx512vl(auVar48,auVar38,auVar12,0xf8);
        auVar38 = ZEXT416((uint)(auVar38._0_4_ + auVar39._0_4_));
        auVar38 = vroundss_avx(auVar38,auVar38,0xb);
        if ((int)auVar38._0_4_ + iVar25 <= iimage->height) {
          fVar3 = fVar3 + 0.5;
          lVar27 = 0x7c;
          for (uVar22 = 0xfffffff4; (int)uVar22 < 0xc; uVar22 = uVar22 + 2) {
            auVar38._0_4_ = (float)(int)uVar22;
            auVar38._4_12_ = in_ZMM8._4_12_;
            auVar38 = vfmadd213ss_fma(auVar38,auVar79._0_16_,ZEXT416((uint)(fVar78 + 0.5)));
            iVar20 = (int)auVar38._0_4_;
            auVar54._0_4_ = (float)(int)(uVar22 | 1);
            auVar54._4_12_ = in_ZMM8._4_12_;
            auVar38 = vfmadd213ss_fma(auVar54,auVar79._0_16_,ZEXT416((uint)(fVar78 + 0.5)));
            iVar19 = (int)auVar38._0_4_;
            lVar26 = lVar27;
            for (iVar21 = -0xc; iVar21 < 0xc; iVar21 = iVar21 + 8) {
              auVar55._0_4_ = (float)iVar21;
              auVar55._4_12_ = in_ZMM8._4_12_;
              auVar38 = vfmadd213ss_fma(auVar55,auVar47,ZEXT416((uint)fVar3));
              auVar56._0_4_ = (float)(iVar21 + 1);
              auVar74 = auVar73._4_12_;
              auVar56._4_12_ = auVar74;
              auVar39 = vfmadd213ss_fma(auVar56,auVar47,ZEXT416((uint)fVar3));
              auVar57._0_4_ = (float)(iVar21 + 2);
              auVar57._4_12_ = auVar74;
              auVar43 = ZEXT416((uint)fVar3);
              auVar40 = vfmadd213ss_fma(auVar57,auVar47,auVar43);
              auVar58._0_4_ = (float)(iVar21 + 3);
              auVar58._4_12_ = auVar74;
              auVar41 = vfmadd213ss_fma(auVar58,auVar47,auVar43);
              auVar59._0_4_ = (float)(iVar21 + 4);
              auVar59._4_12_ = auVar74;
              auVar42 = vfmadd213ss_fma(auVar59,auVar47,auVar43);
              auVar60._0_4_ = (float)(iVar21 + 5);
              auVar60._4_12_ = auVar74;
              auVar43 = vfmadd213ss_fma(auVar60,auVar47,auVar43);
              auVar61._0_4_ = (float)(iVar21 + 6);
              auVar61._4_12_ = auVar74;
              auVar44 = vfmadd213ss_fma(auVar61,auVar47,ZEXT416((uint)fVar3));
              auVar62._0_4_ = (float)(iVar21 + 7);
              auVar62._4_12_ = auVar74;
              auVar45 = vfmadd213ss_fma(auVar62,auVar47,ZEXT416((uint)fVar3));
              haarXY_unconditional
                        (iimage,iVar20,(int)auVar38._0_4_,iVar25,
                         (float *)((long)haarResponseX + lVar26 + -0x7c),
                         (float *)((long)haarResponseY + lVar26 + -0x7c));
              haarXY_unconditional
                        (iimage,iVar19,(int)auVar38._0_4_,iVar25,
                         (float *)((long)haarResponseX + lVar26 + -0x1c),
                         (float *)((long)haarResponseY + lVar26 + -0x1c));
              haarXY_unconditional
                        (iimage,iVar20,(int)auVar39._0_4_,iVar25,
                         (float *)((long)haarResponseX + lVar26 + -0x78),
                         (float *)((long)haarResponseY + lVar26 + -0x78));
              haarXY_unconditional
                        (iimage,iVar19,(int)auVar39._0_4_,iVar25,
                         (float *)((long)haarResponseX + lVar26 + -0x18),
                         (float *)((long)haarResponseY + lVar26 + -0x18));
              haarXY_unconditional
                        (iimage,iVar20,(int)auVar40._0_4_,iVar25,
                         (float *)((long)haarResponseX + lVar26 + -0x74),
                         (float *)((long)haarResponseY + lVar26 + -0x74));
              haarXY_unconditional
                        (iimage,iVar19,(int)auVar40._0_4_,iVar25,
                         (float *)((long)haarResponseX + lVar26 + -0x14),
                         (float *)((long)haarResponseY + lVar26 + -0x14));
              haarXY_unconditional
                        (iimage,iVar20,(int)auVar41._0_4_,iVar25,
                         (float *)((long)haarResponseX + lVar26 + -0x70),
                         (float *)((long)haarResponseY + lVar26 + -0x70));
              haarXY_unconditional
                        (iimage,iVar19,(int)auVar41._0_4_,iVar25,
                         (float *)((long)haarResponseX + lVar26 + -0x10),
                         (float *)((long)haarResponseY + lVar26 + -0x10));
              haarXY_unconditional
                        (iimage,iVar20,(int)auVar42._0_4_,iVar25,
                         (float *)((long)haarResponseX + lVar26 + -0x6c),
                         (float *)((long)haarResponseY + lVar26 + -0x6c));
              haarXY_unconditional
                        (iimage,iVar19,(int)auVar42._0_4_,iVar25,
                         (float *)((long)haarResponseX + lVar26 + -0xc),
                         (float *)((long)haarResponseY + lVar26 + -0xc));
              haarXY_unconditional
                        (iimage,iVar20,(int)auVar43._0_4_,iVar25,
                         (float *)((long)haarResponseX + lVar26 + -0x68),
                         (float *)((long)haarResponseY + lVar26 + -0x68));
              haarXY_unconditional
                        (iimage,iVar19,(int)auVar43._0_4_,iVar25,
                         (float *)((long)haarResponseX + lVar26 + -8),
                         (float *)((long)haarResponseY + lVar26 + -8));
              haarXY_unconditional
                        (iimage,iVar20,(int)auVar44._0_4_,iVar25,
                         (float *)((long)haarResponseX + lVar26 + -100),
                         (float *)((long)haarResponseY + lVar26 + -100));
              haarXY_unconditional
                        (iimage,iVar19,(int)auVar44._0_4_,iVar25,
                         (float *)((long)haarResponseX + lVar26 + -4),
                         (float *)((long)haarResponseY + lVar26 + -4));
              haarXY_unconditional
                        (iimage,iVar20,(int)auVar45._0_4_,iVar25,
                         (float *)((long)haarResponseX + lVar26 + -0x60),
                         (float *)((long)haarResponseY + lVar26 + -0x60));
              haarXY_unconditional
                        (iimage,iVar19,(int)auVar45._0_4_,iVar25,
                         (float *)((long)haarResponseX + lVar26),
                         (float *)((long)haarResponseY + lVar26));
              lVar26 = lVar26 + 0x20;
            }
            auVar79 = ZEXT1664(auVar47);
            lVar27 = lVar27 + 0xc0;
          }
          goto LAB_0016fc07;
        }
      }
    }
  }
  lVar27 = 0x7c;
  for (uVar22 = 0xfffffff4; (int)uVar22 < 0xc; uVar22 = uVar22 + 2) {
    auVar53._0_4_ = (float)(int)uVar22;
    auVar53._4_12_ = in_ZMM8._4_12_;
    auVar38 = vfmadd213ss_fma(auVar53,auVar79._0_16_,ZEXT416((uint)fVar78));
    auVar64._0_4_ = (float)(int)(uVar22 | 1);
    auVar64._4_12_ = in_ZMM8._4_12_;
    fVar51 = auVar38._0_4_;
    auVar38 = vfmadd213ss_fma(auVar64,auVar79._0_16_,ZEXT416((uint)fVar78));
    fVar63 = auVar38._0_4_;
    iVar19 = (int)((double)((ulong)(0.0 <= fVar51) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar51) * -0x4020000000000000) + (double)fVar51);
    iVar20 = (int)((double)((ulong)(0.0 <= fVar63) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar63) * -0x4020000000000000) + (double)fVar63);
    lVar26 = lVar27;
    for (iVar21 = -0xc; iVar21 < 0xc; iVar21 = iVar21 + 8) {
      auVar38 = vpbroadcastd_avx512vl();
      auVar38 = vpaddd_avx(auVar38,_DAT_002716b0);
      in_ZMM8 = ZEXT1664(ZEXT816(0xbfe0000000000000));
      auVar65._0_4_ = (float)iVar21;
      auVar74 = in_ZMM9._4_12_;
      auVar65._4_12_ = auVar74;
      auVar39 = vfmadd213ss_fma(auVar65,auVar47,auVar40);
      auVar67._0_4_ = (float)(iVar21 + 1);
      auVar67._4_12_ = auVar74;
      auVar41 = vfmadd213ss_fma(auVar67,auVar47,auVar40);
      auVar70._0_4_ = (float)(iVar21 + 2);
      auVar70._4_12_ = auVar74;
      auVar42 = vfmadd213ss_fma(auVar70,auVar47,auVar40);
      auVar72._0_4_ = (float)(iVar21 + 3);
      auVar72._4_12_ = auVar74;
      auVar43 = vfmadd213ss_fma(auVar72,auVar47,auVar40);
      fVar51 = auVar39._0_4_;
      fVar63 = auVar41._0_4_;
      fVar68 = auVar42._0_4_;
      col_06 = (int)((double)((ulong)(0.0 <= fVar51) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar51) * -0x4020000000000000) + (double)fVar51);
      col = (int)((double)((ulong)(0.0 <= fVar63) * 0x3fe0000000000000 +
                          (ulong)(0.0 > fVar63) * -0x4020000000000000) + (double)fVar63);
      fVar51 = auVar43._0_4_;
      col_00 = (int)((double)((ulong)(0.0 <= fVar68) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar68) * -0x4020000000000000) + (double)fVar68);
      auVar38 = vcvtdq2ps_avx(auVar38);
      col_01 = (int)((double)((ulong)(0.0 <= fVar51) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar51) * -0x4020000000000000) + (double)fVar51);
      auVar18._4_4_ = fVar3;
      auVar18._0_4_ = fVar3;
      auVar18._8_4_ = fVar3;
      auVar18._12_4_ = fVar3;
      auVar17._4_4_ = fVar52;
      auVar17._0_4_ = fVar52;
      auVar17._8_4_ = fVar52;
      auVar17._12_4_ = fVar52;
      auVar39 = vfmadd132ps_fma(auVar38,auVar18,auVar17);
      uVar24 = vcmpps_avx512vl(auVar39,_DAT_002711c0,0xd);
      auVar38 = vshufps_avx(auVar39,auVar39,0xff);
      bVar14 = (byte)(uVar24 >> 3);
      bVar15 = (byte)(uVar24 >> 2);
      bVar16 = (byte)(uVar24 >> 1);
      col_02 = (int)((double)((ulong)(bVar14 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar14 & 1) * -0x4020000000000000) +
                    (double)auVar38._0_4_);
      auVar38 = vshufpd_avx(auVar39,auVar39,1);
      col_03 = (int)((double)((ulong)(bVar15 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar15 & 1) * -0x4020000000000000) +
                    (double)auVar38._0_4_);
      auVar38 = vmovshdup_avx(auVar39);
      col_04 = (int)((double)((ulong)(bVar16 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar16 & 1) * -0x4020000000000000) +
                    (double)auVar38._0_4_);
      col_05 = (int)((double)((ulong)((byte)uVar24 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)((byte)uVar24 & 1) * -0x4020000000000000) +
                    (double)auVar39._0_4_);
      haarXY_precheck_boundaries
                (iimage,iVar19,col_06,iVar25,(float *)((long)haarResponseX + lVar26 + -0x7c),
                 (float *)((long)haarResponseY + lVar26 + -0x7c));
      haarXY_precheck_boundaries
                (iimage,iVar20,col_06,iVar25,(float *)((long)haarResponseX + lVar26 + -0x1c),
                 (float *)((long)haarResponseY + lVar26 + -0x1c));
      haarXY_precheck_boundaries
                (iimage,iVar19,col,iVar25,(float *)((long)haarResponseX + lVar26 + -0x78),
                 (float *)((long)haarResponseY + lVar26 + -0x78));
      haarXY_precheck_boundaries
                (iimage,iVar20,col,iVar25,(float *)((long)haarResponseX + lVar26 + -0x18),
                 (float *)((long)haarResponseY + lVar26 + -0x18));
      haarXY_precheck_boundaries
                (iimage,iVar19,col_00,iVar25,(float *)((long)haarResponseX + lVar26 + -0x74),
                 (float *)((long)haarResponseY + lVar26 + -0x74));
      haarXY_precheck_boundaries
                (iimage,iVar20,col_00,iVar25,(float *)((long)haarResponseX + lVar26 + -0x14),
                 (float *)((long)haarResponseY + lVar26 + -0x14));
      haarXY_precheck_boundaries
                (iimage,iVar19,col_01,iVar25,(float *)((long)haarResponseX + lVar26 + -0x70),
                 (float *)((long)haarResponseY + lVar26 + -0x70));
      haarXY_precheck_boundaries
                (iimage,iVar20,col_01,iVar25,(float *)((long)haarResponseX + lVar26 + -0x10),
                 (float *)((long)haarResponseY + lVar26 + -0x10));
      haarXY_precheck_boundaries
                (iimage,iVar19,col_02,iVar25,(float *)((long)haarResponseX + lVar26 + -0x6c),
                 (float *)((long)haarResponseY + lVar26 + -0x6c));
      haarXY_precheck_boundaries
                (iimage,iVar20,col_02,iVar25,(float *)((long)haarResponseX + lVar26 + -0xc),
                 (float *)((long)haarResponseY + lVar26 + -0xc));
      haarXY_precheck_boundaries
                (iimage,iVar19,col_03,iVar25,(float *)((long)haarResponseX + lVar26 + -0x68),
                 (float *)((long)haarResponseY + lVar26 + -0x68));
      haarXY_precheck_boundaries
                (iimage,iVar20,col_03,iVar25,(float *)((long)haarResponseX + lVar26 + -8),
                 (float *)((long)haarResponseY + lVar26 + -8));
      haarXY_precheck_boundaries
                (iimage,iVar19,col_04,iVar25,(float *)((long)haarResponseX + lVar26 + -100),
                 (float *)((long)haarResponseY + lVar26 + -100));
      haarXY_precheck_boundaries
                (iimage,iVar20,col_04,iVar25,(float *)((long)haarResponseX + lVar26 + -4),
                 (float *)((long)haarResponseY + lVar26 + -4));
      haarXY_precheck_boundaries
                (iimage,iVar19,col_05,iVar25,(float *)((long)haarResponseX + lVar26 + -0x60),
                 (float *)((long)haarResponseY + lVar26 + -0x60));
      haarXY_precheck_boundaries
                (iimage,iVar20,col_05,iVar25,(float *)((long)haarResponseX + lVar26),
                 (float *)((long)haarResponseY + lVar26));
      lVar26 = lVar26 + 0x20;
    }
    auVar79 = ZEXT1664(auVar47);
    lVar27 = lVar27 + 0xc0;
  }
LAB_0016fc07:
  fVar78 = auVar79._0_4_;
  auVar77._8_4_ = 0x3effffff;
  auVar77._0_8_ = 0x3effffff3effffff;
  auVar77._12_4_ = 0x3effffff;
  auVar76._8_4_ = 0x80000000;
  auVar76._0_8_ = 0x8000000080000000;
  auVar76._12_4_ = 0x80000000;
  auVar38 = vpternlogd_avx512vl(auVar77,ZEXT416((uint)(fVar78 * 0.5)),auVar76,0xf8);
  auVar38 = ZEXT416((uint)(fVar78 * 0.5 + auVar38._0_4_));
  auVar38 = vroundss_avx(auVar38,auVar38,0xb);
  auVar39 = vpternlogd_avx512vl(auVar77,ZEXT416((uint)(fVar78 * 1.5)),auVar76,0xf8);
  auVar39 = ZEXT416((uint)(fVar78 * 1.5 + auVar39._0_4_));
  auVar39 = vroundss_avx(auVar39,auVar39,0xb);
  auVar40 = vpternlogd_avx512vl(auVar77,ZEXT416((uint)(fVar78 * 2.5)),auVar76,0xf8);
  auVar40 = ZEXT416((uint)(fVar78 * 2.5 + auVar40._0_4_));
  auVar40 = vroundss_avx(auVar40,auVar40,0xb);
  auVar41 = vpternlogd_avx512vl(auVar77,ZEXT416((uint)(fVar78 * 3.5)),auVar76,0xf8);
  auVar41 = ZEXT416((uint)(fVar78 * 3.5 + auVar41._0_4_));
  auVar41 = vroundss_avx(auVar41,auVar41,0xb);
  auVar42 = vpternlogd_avx512vl(auVar77,ZEXT416((uint)(fVar78 * 4.5)),auVar76,0xf8);
  auVar42 = ZEXT416((uint)(fVar78 * 4.5 + auVar42._0_4_));
  auVar42 = vroundss_avx(auVar42,auVar42,0xb);
  auVar43 = vpternlogd_avx512vl(auVar77,ZEXT416((uint)(fVar78 * 5.5)),auVar76,0xf8);
  auVar43 = ZEXT416((uint)(fVar78 * 5.5 + auVar43._0_4_));
  auVar43 = vroundss_avx(auVar43,auVar43,0xb);
  auVar44 = vpternlogd_avx512vl(auVar77,ZEXT416((uint)(fVar78 * 6.5)),auVar76,0xf8);
  auVar44 = ZEXT416((uint)(fVar78 * 6.5 + auVar44._0_4_));
  auVar44 = vroundss_avx(auVar44,auVar44,0xb);
  auVar45 = vpternlogd_avx512vl(auVar77,ZEXT416((uint)(fVar78 * 7.5)),auVar76,0xf8);
  auVar45 = ZEXT416((uint)(auVar45._0_4_ + fVar78 * 7.5));
  auVar45 = vroundss_avx(auVar45,auVar45,0xb);
  auVar46 = vpternlogd_avx512vl(auVar77,ZEXT416((uint)(fVar78 * 8.5)),auVar76,0xf8);
  auVar46 = ZEXT416((uint)(fVar78 * 8.5 + auVar46._0_4_));
  auVar46 = vroundss_avx(auVar46,auVar46,0xb);
  auVar47 = vpternlogd_avx512vl(auVar77,ZEXT416((uint)(fVar78 * 9.5)),auVar76,0xf8);
  auVar47 = ZEXT416((uint)(fVar78 * 9.5 + auVar47._0_4_));
  auVar47 = vroundss_avx(auVar47,auVar47,0xb);
  auVar48 = vpternlogd_avx512vl(auVar77,ZEXT416((uint)(fVar78 * 10.5)),auVar76,0xf8);
  auVar48 = ZEXT416((uint)(fVar78 * 10.5 + auVar48._0_4_));
  auVar48 = vroundss_avx(auVar48,auVar48,0xb);
  auVar49 = vpternlogd_avx512vl(auVar77,ZEXT416((uint)(fVar78 * 11.5)),auVar76,0xf8);
  fVar66 = auVar40._0_4_;
  fVar52 = fVar66 + auVar39._0_4_;
  fVar3 = fVar66 + auVar38._0_4_;
  auVar40 = ZEXT416((uint)(fVar78 * 11.5 + auVar49._0_4_));
  auVar40 = vroundss_avx(auVar40,auVar40,0xb);
  fVar78 = fVar66 - auVar38._0_4_;
  fVar51 = fVar66 - auVar39._0_4_;
  fVar63 = fVar66 - auVar41._0_4_;
  fVar68 = fVar66 - auVar42._0_4_;
  fVar4 = fVar66 - auVar43._0_4_;
  fVar66 = fVar66 - auVar44._0_4_;
  fVar75 = auVar45._0_4_;
  fVar5 = fVar75 - auVar41._0_4_;
  fVar6 = fVar75 - auVar42._0_4_;
  fVar7 = fVar75 - auVar43._0_4_;
  fVar8 = fVar75 - auVar44._0_4_;
  fVar9 = fVar75 - auVar46._0_4_;
  fVar10 = fVar75 - auVar47._0_4_;
  fVar11 = fVar75 - auVar48._0_4_;
  fVar75 = fVar75 - auVar40._0_4_;
  gauss_s1_c0[0] = expf(fVar52 * fVar52 * fVar50);
  gauss_s1_c0[1] = expf(fVar3 * fVar3 * fVar50);
  gauss_s1_c0[2] = expf(fVar78 * fVar78 * fVar50);
  gauss_s1_c0[3] = expf(fVar51 * fVar51 * fVar50);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar63 * fVar63 * fVar50);
  gauss_s1_c0[6] = expf(fVar68 * fVar68 * fVar50);
  gauss_s1_c0[7] = expf(fVar4 * fVar4 * fVar50);
  gauss_s1_c0[8] = expf(fVar66 * fVar66 * fVar50);
  gauss_s1_c1[0] = expf(fVar5 * fVar5 * fVar50);
  gauss_s1_c1[1] = expf(fVar6 * fVar6 * fVar50);
  gauss_s1_c1[2] = expf(fVar7 * fVar7 * fVar50);
  gauss_s1_c1[3] = expf(fVar8 * fVar8 * fVar50);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar9 * fVar9 * fVar50);
  gauss_s1_c1[6] = expf(fVar10 * fVar10 * fVar50);
  gauss_s1_c1[7] = expf(fVar11 * fVar11 * fVar50);
  gauss_s1_c1[8] = expf(fVar75 * fVar75 * fVar50);
  auVar73 = ZEXT1264(ZEXT812(0));
  lVar27 = 0;
  auVar47._8_4_ = 0x7fffffff;
  auVar47._0_8_ = 0x7fffffff7fffffff;
  auVar47._12_4_ = 0x7fffffff;
  iVar25 = 0;
  lVar26 = 0;
  uVar24 = 0xfffffffffffffff8;
  while (uVar22 = (uint)uVar24, (int)uVar22 < 8) {
    pfVar36 = gauss_s1_c1;
    if (uVar22 != 7) {
      pfVar36 = gauss_s1_c0;
    }
    lVar35 = (long)iVar25;
    lVar26 = (long)(int)lVar26;
    iVar25 = iVar25 + 4;
    if (uVar22 == 0xfffffff8) {
      pfVar36 = gauss_s1_c1;
    }
    uVar28 = 0;
    uVar33 = 0xfffffffffffffff8;
    lVar29 = lVar27;
    while (lVar35 != iVar25) {
      pfVar37 = gauss_s1_c1;
      iVar21 = (int)uVar33;
      if (iVar21 != 7) {
        pfVar37 = gauss_s1_c0;
      }
      auVar79 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar33 = (ulong)((uint)(uVar33 >> 0x1c) & 8);
      if (iVar21 == -8) {
        pfVar37 = gauss_s1_c1;
      }
      lVar30 = (long)haarResponseX + lVar29;
      lVar31 = (long)haarResponseY + lVar29;
      for (uVar23 = uVar28; uVar23 < iVar21 * 0x18 + 0x198; uVar23 = uVar23 + 0x18) {
        lVar32 = 0;
        pfVar34 = (float *)((long)pfVar36 + (ulong)(((uint)(uVar24 >> 0x1f) & 1) << 5));
        while (lVar32 != 9) {
          fVar52 = *pfVar34;
          pfVar34 = pfVar34 + (ulong)(~uVar22 >> 0x1f) * 2 + -1;
          lVar1 = lVar32 * 4;
          lVar2 = lVar32 * 4;
          lVar32 = lVar32 + 1;
          auVar40 = ZEXT416((uint)(pfVar37[uVar33] * fVar52 * *(float *)(lVar30 + lVar2)));
          auVar38 = vandps_avx(auVar40,auVar47);
          auVar41 = ZEXT416((uint)(pfVar37[uVar33] * fVar52 * *(float *)(lVar31 + lVar1)));
          auVar39 = vandps_avx(auVar41,auVar47);
          auVar40 = vinsertps_avx(auVar41,auVar40,0x10);
          auVar39 = vmovlhps_avx(auVar40,auVar39);
          auVar38 = vinsertps_avx(auVar39,auVar38,0x30);
          auVar79 = ZEXT1664(CONCAT412(auVar79._12_4_ + auVar38._12_4_,
                                       CONCAT48(auVar79._8_4_ + auVar38._8_4_,
                                                CONCAT44(auVar79._4_4_ + auVar38._4_4_,
                                                         auVar79._0_4_ + auVar38._0_4_))));
        }
        uVar33 = uVar33 + (ulong)(-1 < iVar21) * 2 + -1;
        lVar30 = lVar30 + 0x60;
        lVar31 = lVar31 + 0x60;
      }
      uVar33 = (ulong)(iVar21 + 5);
      uVar28 = uVar28 + 0x78;
      lVar29 = lVar29 + 0x1e0;
      fVar52 = gauss_s2_arr[lVar35];
      auVar13._4_4_ = fVar52;
      auVar13._0_4_ = fVar52;
      auVar13._8_4_ = fVar52;
      auVar13._12_4_ = fVar52;
      auVar41 = vmulps_avx512vl(auVar79._0_16_,auVar13);
      lVar35 = lVar35 + 1;
      auVar71._0_4_ = auVar41._0_4_ * auVar41._0_4_;
      auVar71._4_4_ = auVar41._4_4_ * auVar41._4_4_;
      auVar71._8_4_ = auVar41._8_4_ * auVar41._8_4_;
      auVar71._12_4_ = auVar41._12_4_ * auVar41._12_4_;
      auVar39 = vshufpd_avx(auVar41,auVar41,1);
      *(undefined1 (*) [16])(ipoint->descriptor + lVar26) = auVar41;
      lVar26 = lVar26 + 4;
      auVar38 = vmovshdup_avx(auVar71);
      auVar40 = vfmadd231ss_fma(auVar38,auVar41,auVar41);
      auVar38 = vshufps_avx(auVar41,auVar41,0xff);
      auVar39 = vfmadd213ss_fma(auVar39,auVar39,auVar40);
      auVar38 = vfmadd213ss_fma(auVar38,auVar38,auVar39);
      auVar73 = ZEXT464((uint)(auVar73._0_4_ + auVar38._0_4_));
    }
    lVar27 = lVar27 + 0x14;
    uVar24 = (ulong)(uVar22 + 5);
  }
  if (auVar73._0_4_ < 0.0) {
    fVar52 = sqrtf(auVar73._0_4_);
  }
  else {
    auVar38 = vsqrtss_avx(auVar73._0_16_,auVar73._0_16_);
    fVar52 = auVar38._0_4_;
  }
  for (lVar27 = 0; lVar27 != 0x40; lVar27 = lVar27 + 1) {
    ipoint->descriptor[lVar27] = (1.0 / fVar52) * ipoint->descriptor[lVar27];
  }
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_2_8_True(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=2, l_count+=2) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            float ipoint_y_sub_int_scale_add_l1_mul_scale = ipoint_y_sub_int_scale + l1 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_l1_mul_scale + (ipoint_y_sub_int_scale_add_l1_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=8, k_count+=8) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k4 = k + 4;
                int k5 = k + 5;
                int k6 = k + 6;
                int k7 = k + 7;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int k_count4 = k_count + 4;
                int k_count5 = k_count + 5;
                int k_count6 = k_count + 6;
                int k_count7 = k_count + 7;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                float ipoint_x_sub_int_scale_add_k1_mul_scale = ipoint_x_sub_int_scale + k1 * scale;
                float ipoint_x_sub_int_scale_add_k2_mul_scale = ipoint_x_sub_int_scale + k2 * scale;
                float ipoint_x_sub_int_scale_add_k3_mul_scale = ipoint_x_sub_int_scale + k3 * scale;
                float ipoint_x_sub_int_scale_add_k4_mul_scale = ipoint_x_sub_int_scale + k4 * scale;
                float ipoint_x_sub_int_scale_add_k5_mul_scale = ipoint_x_sub_int_scale + k5 * scale;
                float ipoint_x_sub_int_scale_add_k6_mul_scale = ipoint_x_sub_int_scale + k6 * scale;
                float ipoint_x_sub_int_scale_add_k7_mul_scale = ipoint_x_sub_int_scale + k7 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_k1_mul_scale + (ipoint_x_sub_int_scale_add_k1_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_k2_mul_scale + (ipoint_x_sub_int_scale_add_k2_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_k3_mul_scale + (ipoint_x_sub_int_scale_add_k3_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale4 = (int) (ipoint_x_sub_int_scale_add_k4_mul_scale + (ipoint_x_sub_int_scale_add_k4_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale5 = (int) (ipoint_x_sub_int_scale_add_k5_mul_scale + (ipoint_x_sub_int_scale_add_k5_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale6 = (int) (ipoint_x_sub_int_scale_add_k6_mul_scale + (ipoint_x_sub_int_scale_add_k6_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale7 = (int) (ipoint_x_sub_int_scale_add_k7_mul_scale + (ipoint_x_sub_int_scale_add_k7_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count1*24+k_count3], &haarResponseY[l_count1*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count0*24+k_count4], &haarResponseY[l_count0*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count1*24+k_count4], &haarResponseY[l_count1*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count0*24+k_count5], &haarResponseY[l_count0*24+k_count5]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count1*24+k_count5], &haarResponseY[l_count1*24+k_count5]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale6, int_scale, &haarResponseX[l_count0*24+k_count6], &haarResponseY[l_count0*24+k_count6]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale6, int_scale, &haarResponseX[l_count1*24+k_count6], &haarResponseY[l_count1*24+k_count6]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale7, int_scale, &haarResponseX[l_count0*24+k_count7], &haarResponseY[l_count0*24+k_count7]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale7, int_scale, &haarResponseX[l_count1*24+k_count7], &haarResponseY[l_count1*24+k_count7]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=2, l_count+=2) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_05 + l1 * scale);

            for (int k=-12, k_count=0; k<12; k+=8, k_count+=8) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k4 = k + 4;
                int k5 = k + 5;
                int k6 = k + 6;
                int k7 = k + 7;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int k_count4 = k_count + 4;
                int k_count5 = k_count + 5;
                int k_count6 = k_count + 6;
                int k_count7 = k_count + 7;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_05 + k1 * scale);
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_05 + k2 * scale);
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_05 + k3 * scale);
                int sample_x_sub_int_scale4 = (int) (ipoint_x_sub_int_scale_add_05 + k4 * scale);
                int sample_x_sub_int_scale5 = (int) (ipoint_x_sub_int_scale_add_05 + k5 * scale);
                int sample_x_sub_int_scale6 = (int) (ipoint_x_sub_int_scale_add_05 + k6 * scale);
                int sample_x_sub_int_scale7 = (int) (ipoint_x_sub_int_scale_add_05 + k7 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count1*24+k_count3], &haarResponseY[l_count1*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count0*24+k_count4], &haarResponseY[l_count0*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count1*24+k_count4], &haarResponseY[l_count1*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count0*24+k_count5], &haarResponseY[l_count0*24+k_count5]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count1*24+k_count5], &haarResponseY[l_count1*24+k_count5]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale6, int_scale, &haarResponseX[l_count0*24+k_count6], &haarResponseY[l_count0*24+k_count6]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale6, int_scale, &haarResponseX[l_count1*24+k_count6], &haarResponseY[l_count1*24+k_count6]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale7, int_scale, &haarResponseX[l_count0*24+k_count7], &haarResponseY[l_count0*24+k_count7]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale7, int_scale, &haarResponseX[l_count1*24+k_count7], &haarResponseY[l_count1*24+k_count7]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}